

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::CellConservativeQuartic::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__0>
               (Box *bx,int ncomp,anon_class_128_2_8e273704 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  undefined8 *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int n_00;
  int in_stack_ffffffffffffff2c;
  undefined8 uVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffff3c;
  
  uVar4 = *in_RDI;
  n_00 = *(int *)(in_RDI + 1);
  iVar1 = *(int *)((long)in_RDI + 0xc);
  iVar2 = *(int *)(in_RDI + 2);
  iVar3 = *(int *)((long)in_RDI + 0x14);
  local_108 = n_00;
  for (local_104 = 0; iVar5 = local_108, local_104 < in_ESI; local_104 = local_104 + 1) {
    for (; local_108 <= iVar3; local_108 = local_108 + 1) {
      for (local_10c = (int)((ulong)uVar4 >> 0x20); local_10c <= iVar2; local_10c = local_10c + 1) {
        for (local_110 = (int)uVar4; local_110 <= iVar1; local_110 = local_110 + 1) {
          CellConservativeQuartic::interp::anon_class_128_2_8e273704::operator()
                    ((anon_class_128_2_8e273704 *)CONCAT44(in_stack_ffffffffffffff3c,iVar5),
                     (int)((ulong)uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffff2c,n_00);
        }
      }
    }
    local_108 = iVar5;
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, int ncomp, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int n = 0; n < ncomp; ++n) {
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k,n);
    }}}}
}